

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_21daf9::SHDescriptor::IsSegwit(SHDescriptor *this)

{
  long lVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*(long *)(((this->super_DescriptorImpl).m_subdescriptor_args.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                                ._M_t + 0x58))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (uVar2 & 0x1ffffffff) == 0x100000002;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSegwit() const { return m_subdescriptor_args[0]->GetOutputType() == OutputType::BECH32; }